

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

int Lodtalk::executeScriptFromFile
              (InterpreterProxy *interpreter,FILE *file,string *name,string *basePath)

{
  OopRef *this;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ScriptContext *pSVar3;
  Oop OVar4;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar5;
  Node *pNVar6;
  shared_ptr<Lodtalk::EvaluationScope> local_f0;
  undefined1 local_e0 [8];
  ASTInterpreter astInterpreter;
  shared_ptr<Lodtalk::GlobalEvaluationScope> scope;
  Node *ast;
  undefined1 local_58 [8];
  Ref<Lodtalk::ScriptContext> context;
  VMContext *vmContext;
  string *basePath_local;
  string *name_local;
  FILE *file_local;
  InterpreterProxy *interpreter_local;
  VMContext *this_00;
  
  iVar2 = (**interpreter->_vptr_InterpreterProxy)();
  this_00 = (VMContext *)CONCAT44(extraout_var,iVar2);
  context.reference.nextReference_ = (OopRef *)this_00;
  pSVar3 = (ScriptContext *)VMContext::basicNativeNewFromClassIndex(this_00,0x62);
  Ref<Lodtalk::ScriptContext>::Ref((Ref<Lodtalk::ScriptContext> *)local_58,this_00,pSVar3);
  bVar1 = Ref<Lodtalk::ScriptContext>::isNil((Ref<Lodtalk::ScriptContext> *)local_58);
  this = context.reference.nextReference_;
  if (bVar1) {
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
  }
  else {
    OVar4 = VMContext::getGlobalContext((VMContext *)context.reference.nextReference_);
    aVar5 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::getClassFromOop((VMContext *)this,OVar4);
    pSVar3 = Ref<Lodtalk::ScriptContext>::operator->((Ref<Lodtalk::ScriptContext> *)local_58);
    (pSVar3->globalContextClass).field_0 = aVar5;
    aVar5 = (anon_union_8_4_0eb573b0_for_Oop_0)
            VMContext::makeByteString((VMContext *)context.reference.nextReference_,basePath);
    pSVar3 = Ref<Lodtalk::ScriptContext>::operator->((Ref<Lodtalk::ScriptContext> *)local_58);
    (pSVar3->basePath).field_0 = aVar5;
    pNVar6 = AST::parseSourceFromFile((VMContext *)context.reference.nextReference_,file);
    if (pNVar6 == (Node *)0x0) {
      interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
    }
    else {
      std::make_shared<Lodtalk::GlobalEvaluationScope,Lodtalk::VMContext*&>
                ((VMContext **)&astInterpreter.currentSelf.nextReference_);
      std::shared_ptr<Lodtalk::EvaluationScope>::shared_ptr<Lodtalk::GlobalEvaluationScope,void>
                (&local_f0,
                 (shared_ptr<Lodtalk::GlobalEvaluationScope> *)
                 &astInterpreter.currentSelf.nextReference_);
      OVar4 = Ref<Lodtalk::ScriptContext>::getOop((Ref<Lodtalk::ScriptContext> *)local_58);
      ASTInterpreter::ASTInterpreter((ASTInterpreter *)local_e0,interpreter,&local_f0,OVar4);
      std::shared_ptr<Lodtalk::EvaluationScope>::~shared_ptr(&local_f0);
      (*pNVar6->_vptr_Node[2])(pNVar6,local_e0);
      interpreter_local._4_4_ = 0;
      ASTInterpreter::~ASTInterpreter((ASTInterpreter *)local_e0);
      std::shared_ptr<Lodtalk::GlobalEvaluationScope>::~shared_ptr
                ((shared_ptr<Lodtalk::GlobalEvaluationScope> *)
                 &astInterpreter.currentSelf.nextReference_);
    }
  }
  Ref<Lodtalk::ScriptContext>::~Ref((Ref<Lodtalk::ScriptContext> *)local_58);
  return interpreter_local._4_4_;
}

Assistant:

int executeScriptFromFile(InterpreterProxy *interpreter, FILE *file, const std::string &name, const std::string &basePath)
{
    // Create the script context
    auto vmContext = interpreter->getContext();
	Ref<ScriptContext> context(vmContext, reinterpret_cast<ScriptContext*> (vmContext->basicNativeNewFromClassIndex(SCI_ScriptContext)));
	if(context.isNil())
		return interpreter->primitiveFailed();

	context->globalContextClass = vmContext->getClassFromOop(vmContext->getGlobalContext());
	context->basePath = vmContext->makeByteString(basePath);

	// Parse the script.
	auto ast = Lodtalk::AST::parseSourceFromFile(vmContext, file);
	if(!ast)
		return interpreter->primitiveFailed();

	// Create the global scope
	auto scope = std::make_shared<GlobalEvaluationScope> (vmContext);

	// Interpret the script.
	ASTInterpreter astInterpreter(interpreter, scope, context.getOop());
	ast->acceptVisitor(&astInterpreter);

    return 0;
}